

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_EXT_convolution(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_EXT_convolution != 0) {
    glad_glConvolutionFilter1DEXT =
         (PFNGLCONVOLUTIONFILTER1DEXTPROC)(*load)("glConvolutionFilter1DEXT");
    glad_glConvolutionFilter2DEXT =
         (PFNGLCONVOLUTIONFILTER2DEXTPROC)(*load)("glConvolutionFilter2DEXT");
    glad_glConvolutionParameterfEXT =
         (PFNGLCONVOLUTIONPARAMETERFEXTPROC)(*load)("glConvolutionParameterfEXT");
    glad_glConvolutionParameterfvEXT =
         (PFNGLCONVOLUTIONPARAMETERFVEXTPROC)(*load)("glConvolutionParameterfvEXT");
    glad_glConvolutionParameteriEXT =
         (PFNGLCONVOLUTIONPARAMETERIEXTPROC)(*load)("glConvolutionParameteriEXT");
    glad_glConvolutionParameterivEXT =
         (PFNGLCONVOLUTIONPARAMETERIVEXTPROC)(*load)("glConvolutionParameterivEXT");
    glad_glCopyConvolutionFilter1DEXT =
         (PFNGLCOPYCONVOLUTIONFILTER1DEXTPROC)(*load)("glCopyConvolutionFilter1DEXT");
    glad_glCopyConvolutionFilter2DEXT =
         (PFNGLCOPYCONVOLUTIONFILTER2DEXTPROC)(*load)("glCopyConvolutionFilter2DEXT");
    glad_glGetConvolutionFilterEXT =
         (PFNGLGETCONVOLUTIONFILTEREXTPROC)(*load)("glGetConvolutionFilterEXT");
    glad_glGetConvolutionParameterfvEXT =
         (PFNGLGETCONVOLUTIONPARAMETERFVEXTPROC)(*load)("glGetConvolutionParameterfvEXT");
    glad_glGetConvolutionParameterivEXT =
         (PFNGLGETCONVOLUTIONPARAMETERIVEXTPROC)(*load)("glGetConvolutionParameterivEXT");
    glad_glGetSeparableFilterEXT =
         (PFNGLGETSEPARABLEFILTEREXTPROC)(*load)("glGetSeparableFilterEXT");
    glad_glSeparableFilter2DEXT = (PFNGLSEPARABLEFILTER2DEXTPROC)(*load)("glSeparableFilter2DEXT");
  }
  return;
}

Assistant:

static void load_GL_EXT_convolution(GLADloadproc load) {
	if(!GLAD_GL_EXT_convolution) return;
	glad_glConvolutionFilter1DEXT = (PFNGLCONVOLUTIONFILTER1DEXTPROC)load("glConvolutionFilter1DEXT");
	glad_glConvolutionFilter2DEXT = (PFNGLCONVOLUTIONFILTER2DEXTPROC)load("glConvolutionFilter2DEXT");
	glad_glConvolutionParameterfEXT = (PFNGLCONVOLUTIONPARAMETERFEXTPROC)load("glConvolutionParameterfEXT");
	glad_glConvolutionParameterfvEXT = (PFNGLCONVOLUTIONPARAMETERFVEXTPROC)load("glConvolutionParameterfvEXT");
	glad_glConvolutionParameteriEXT = (PFNGLCONVOLUTIONPARAMETERIEXTPROC)load("glConvolutionParameteriEXT");
	glad_glConvolutionParameterivEXT = (PFNGLCONVOLUTIONPARAMETERIVEXTPROC)load("glConvolutionParameterivEXT");
	glad_glCopyConvolutionFilter1DEXT = (PFNGLCOPYCONVOLUTIONFILTER1DEXTPROC)load("glCopyConvolutionFilter1DEXT");
	glad_glCopyConvolutionFilter2DEXT = (PFNGLCOPYCONVOLUTIONFILTER2DEXTPROC)load("glCopyConvolutionFilter2DEXT");
	glad_glGetConvolutionFilterEXT = (PFNGLGETCONVOLUTIONFILTEREXTPROC)load("glGetConvolutionFilterEXT");
	glad_glGetConvolutionParameterfvEXT = (PFNGLGETCONVOLUTIONPARAMETERFVEXTPROC)load("glGetConvolutionParameterfvEXT");
	glad_glGetConvolutionParameterivEXT = (PFNGLGETCONVOLUTIONPARAMETERIVEXTPROC)load("glGetConvolutionParameterivEXT");
	glad_glGetSeparableFilterEXT = (PFNGLGETSEPARABLEFILTEREXTPROC)load("glGetSeparableFilterEXT");
	glad_glSeparableFilter2DEXT = (PFNGLSEPARABLEFILTER2DEXTPROC)load("glSeparableFilter2DEXT");
}